

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Reader __thiscall capnp::_::anon_unknown_129::name(anon_unknown_129 *this,DynamicEnum e)

{
  undefined8 uVar1;
  ArrayPtr<const_char> AVar2;
  DynamicEnum e_local;
  SegmentReader *local_58;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::EnumSchema::Enumerant>_2 aStack_50;
  
  e_local.value = (uint16_t)e.schema.super_Schema.raw;
  e_local.schema.super_Schema.raw = (Schema)(Schema)this;
  DynamicEnum::getEnumerant((Maybe<capnp::EnumSchema::Enumerant> *)&local_58,&e_local);
  aStack_50.value._8_8_ = aStack_50.value.proto._reader.data;
  aStack_50.value.parent.super_Schema.raw =
       (EnumSchema)(EnumSchema)aStack_50.value.proto._reader.capTable;
  uVar1 = aStack_50.value.proto._reader.segment;
  if (local_58._0_1_ == true) {
    aStack_50.value.proto._reader.capTable = (CapTableReader *)aStack_50._48_8_;
    aStack_50.value.proto._reader.data = (void *)aStack_50._56_8_;
    aStack_50.value.proto._reader.segment = (SegmentReader *)aStack_50.value.proto._reader.pointers;
    local_58 = (SegmentReader *)uVar1;
    AVar2 = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName((Reader *)&local_58);
  }
  else {
    AVar2.size_ = 0x14;
    AVar2.ptr = "(unknown enumerant)";
  }
  return (StringPtr)(StringPtr)AVar2;
}

Assistant:

Text::Reader name(DynamicEnum e) {
  KJ_IF_MAYBE(schema, e.getEnumerant()) {
    return schema->getProto().getName();
  } else {
    return "(unknown enumerant)";
  }
}